

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_processor.cc
# Opt level: O0

void __thiscall
PacketProcessor::run
          (PacketProcessor *this,
          unique_ptr<PacketReader,_std::default_delete<PacketReader>_> *reader,bool verbose)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  ostream *poVar4;
  pointer pPVar5;
  pointer this_00;
  byte in_DL;
  long in_RDI;
  unique_ptr<Handler,_std::default_delete<Handler>_> *handler;
  iterator __end3;
  iterator __begin3;
  vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
  *__range3;
  shared_ptr<lrit::File> file;
  unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_> *spdu;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
  *__range2;
  vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
  spdus;
  VCDU vcdu;
  array<unsigned_char,_892UL> buf;
  vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
  *in_stack_fffffffffffffb68;
  shared_ptr<const_lrit::File> *in_stack_fffffffffffffb70;
  vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
  *in_stack_fffffffffffffb80;
  ostream *in_stack_fffffffffffffb98;
  shared_ptr<const_lrit::File> local_438;
  reference local_428;
  unique_ptr<Handler,_std::default_delete<Handler>_> *local_420;
  __normal_iterator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_*,_std::vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>_>
  local_418 [6];
  reference local_3e8;
  unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_> *local_3e0;
  __normal_iterator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_*,_std::vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>_>
  local_3d8;
  undefined1 *local_3d0;
  VCDU local_3c8;
  undefined1 local_3c0 [27];
  char local_3a5;
  int local_3a4;
  int local_3a0;
  int local_39c;
  VCDU local_398;
  undefined1 local_38d [125];
  VCDU *in_stack_fffffffffffffcf0;
  Assembler *in_stack_fffffffffffffcf8;
  
  if ((in_DL & 1) != 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Waiting for first packet...");
    poVar4 = std::operator<<(poVar4,"\r");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::flush<char,std::char_traits<char>>);
    std::operator<<(poVar4,"\x1b[K");
  }
  while( true ) {
    pPVar5 = std::unique_ptr<PacketReader,_std::default_delete<PacketReader>_>::operator->
                       ((unique_ptr<PacketReader,_std::default_delete<PacketReader>_> *)0x2b8758);
    uVar2 = (*pPVar5->_vptr_PacketReader[2])(pPVar5,local_38d);
    if ((uVar2 & 1) == 0) break;
    if ((in_DL & 1) != 0) {
      VCDU::VCDU(&local_398,(raw *)local_38d);
      poVar4 = std::operator<<((ostream *)&std::cout,"Packet:");
      poVar4 = std::operator<<(poVar4," SCID=");
      local_39c = (int)std::setw(1);
      poVar4 = std::operator<<(poVar4,(_Setw)local_39c);
      iVar3 = VCDU::getSCID((VCDU *)in_stack_fffffffffffffb70);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
      in_stack_fffffffffffffb98 = std::operator<<(poVar4," VCID=");
      local_3a0 = (int)std::setw(2);
      poVar4 = std::operator<<(in_stack_fffffffffffffb98,(_Setw)local_3a0);
      iVar3 = VCDU::getVCID((VCDU *)0x2b8844);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
      poVar4 = std::operator<<(poVar4," counter=");
      local_3a4 = (int)std::setw(8);
      poVar4 = std::operator<<(poVar4,(_Setw)local_3a4);
      local_3a5 = (char)std::setfill<char>('0');
      poVar4 = std::operator<<(poVar4,local_3a5);
      iVar3 = VCDU::getCounter((VCDU *)in_stack_fffffffffffffb80);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
      poVar4 = std::operator<<(poVar4,"\r");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::flush<char,std::char_traits<char>>);
      std::operator<<(poVar4,"\x1b[K");
    }
    in_stack_fffffffffffffb80 =
         (vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
          *)(in_RDI + 0x18);
    VCDU::VCDU(&local_3c8,(raw *)local_38d);
    assembler::Assembler::process(in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
    local_3d0 = local_3c0;
    local_3d8._M_current =
         (unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_> *)
         std::
         vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
         ::begin((vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
                  *)in_stack_fffffffffffffb68);
    local_3e0 = (unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_> *)
                std::
                vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
                ::end((vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
                       *)in_stack_fffffffffffffb68);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_*,_std::vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>_>
                               *)in_stack_fffffffffffffb70,
                              (__normal_iterator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_*,_std::vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>_>
                               *)in_stack_fffffffffffffb68), bVar1) {
      local_3e8 = __gnu_cxx::
                  __normal_iterator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_*,_std::vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>_>
                  ::operator*(&local_3d8);
      this_00 = std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>
                ::operator->((unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>
                              *)0x2b89b0);
      assembler::SessionPDU::get(this_00);
      std::make_shared<lrit::File,std::vector<unsigned_char,std::allocator<unsigned_char>>const&>
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffb98)
      ;
      local_418[0]._M_current =
           (unique_ptr<Handler,_std::default_delete<Handler>_> *)
           std::
           vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
           ::begin(in_stack_fffffffffffffb68);
      local_420 = (unique_ptr<Handler,_std::default_delete<Handler>_> *)
                  std::
                  vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
                  ::end(in_stack_fffffffffffffb68);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_*,_std::vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>_>
                                 *)in_stack_fffffffffffffb70,
                                (__normal_iterator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_*,_std::vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>_>
                                 *)in_stack_fffffffffffffb68), bVar1) {
        local_428 = __gnu_cxx::
                    __normal_iterator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_*,_std::vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>_>
                    ::operator*(local_418);
        in_stack_fffffffffffffb68 =
             (vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
              *)std::unique_ptr<Handler,_std::default_delete<Handler>_>::operator->
                          ((unique_ptr<Handler,_std::default_delete<Handler>_> *)0x2b8a3e);
        in_stack_fffffffffffffb70 = &local_438;
        std::shared_ptr<lrit::File_const>::shared_ptr<lrit::File,void>
                  (in_stack_fffffffffffffb70,(shared_ptr<lrit::File> *)in_stack_fffffffffffffb68);
        (**(code **)&((element_type *)
                     (in_stack_fffffffffffffb68->
                     super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start)->file_)
                  (in_stack_fffffffffffffb68,in_stack_fffffffffffffb70);
        std::shared_ptr<const_lrit::File>::~shared_ptr((shared_ptr<const_lrit::File> *)0x2b8a76);
        __gnu_cxx::
        __normal_iterator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_*,_std::vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>_>
        ::operator++(local_418);
      }
      std::shared_ptr<lrit::File>::~shared_ptr((shared_ptr<lrit::File> *)0x2b8ad5);
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_*,_std::vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>_>
      ::operator++(&local_3d8);
    }
    std::
    vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
    ::~vector(in_stack_fffffffffffffb80);
  }
  return;
}

Assistant:

void PacketProcessor::run(std::unique_ptr<PacketReader>& reader, bool verbose) {
  if (verbose) {
    std::cout
      << "Waiting for first packet..."
      // Carriage return to return to beginning of line
      << "\r"
      // Flush buffers
      << std::flush
      // Erase in line (expected to be buffered)
      << "\033[K";
  }

  std::array<uint8_t, 892> buf;
  while (reader->nextPacket(buf)) {
    if (verbose) {
      VCDU vcdu(buf);
      std::cout
        << "Packet:"
        << " SCID="
        << std::setw(1) << vcdu.getSCID()
        << " VCID="
        << std::setw(2) << vcdu.getVCID()
        << " counter="
        << std::setw(8) << std::setfill('0') << vcdu.getCounter()
        // Carriage return to return to beginning of line
        << "\r"
        // Flush buffers
        << std::flush
        // Erase in line (expected to be buffered)
        << "\033[K";
    }

    auto spdus = assembler_.process(buf);
    for (auto& spdu : spdus) {
      auto file = std::make_shared<lrit::File>(spdu->get());
      for (auto& handler : handlers_) {
        handler->handle(file);
      }
    }
  }
}